

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lista_tests.cpp
# Opt level: O2

void __thiscall
lista_test_test_agregar_varios_elementos_adelante_y_atras_Test::
~lista_test_test_agregar_varios_elementos_adelante_y_atras_Test
          (lista_test_test_agregar_varios_elementos_adelante_y_atras_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(lista_test, test_agregar_varios_elementos_adelante_y_atras) {
    Lista<int> l;
    l.agregarAdelante(42);
    l.agregarAdelante(41);
    l.agregarAtras(43);
    l.agregarAdelante(40);
    l.agregarAtras(44);
    ASSERT_EQ(l.longitud(), 5);
    ASSERT_EQ(l.iesimo(0), 40);
    ASSERT_EQ(l.iesimo(1), 41);
    ASSERT_EQ(l.iesimo(2), 42);
    ASSERT_EQ(l.iesimo(3), 43);
    ASSERT_EQ(l.iesimo(4), 44);
}